

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O3

void gf_25519_mulw_unsigned(gf_25519_s *cs,gf_25519_s *as,uint32_t b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  uint64_t lo;
  ulong uVar16;
  uint64_t lo_2;
  ulong uVar17;
  ulong uVar18;
  uint64_t lo_1;
  
  uVar18 = CONCAT44(0,b);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar18;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = as->limb[0];
  uVar15 = SUB168(auVar1 * auVar6,0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SUB168(auVar1 * auVar6,8) << 0xd | uVar15 >> 0x33;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar18;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = as->limb[1];
  auVar11 = auVar2 * auVar7 + auVar11;
  uVar16 = auVar11._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar11._8_8_ << 0xd | uVar16 >> 0x33;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar18;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = as->limb[2];
  auVar12 = auVar3 * auVar8 + auVar12;
  uVar17 = auVar12._0_8_;
  cs->limb[2] = uVar17 & 0x7ffffffffffff;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar12._8_8_ << 0xd | uVar17 >> 0x33;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar18;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = as->limb[3];
  auVar13 = auVar4 * auVar9 + auVar13;
  uVar17 = auVar13._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar13._8_8_ << 0xd | uVar17 >> 0x33;
  cs->limb[3] = uVar17 & 0x7ffffffffffff;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar18;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = as->limb[4];
  auVar14 = auVar5 * auVar10 + auVar14;
  uVar17 = auVar14._0_8_;
  cs->limb[4] = uVar17 & 0x7ffffffffffff;
  uVar15 = (auVar14._8_8_ << 0xd | uVar17 >> 0x33) * 0x13 + (uVar15 & 0x7ffffffffffff);
  cs->limb[0] = uVar15 & 0x7ffffffffffff;
  cs->limb[1] = (uVar15 >> 0x33) + (uVar16 & 0x7ffffffffffff);
  return;
}

Assistant:

void gf_mulw_unsigned (gf_s *__restrict__ cs, const gf as, uint32_t b) {
    const uint64_t *a = as->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;

    __uint128_t accum = widemul_rm(b, &a[0]);
    uint64_t c0 = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[1]);
    uint64_t c1 = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[2]);
    c[2] = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[3]);
    c[3] = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[4]);
    c[4] = accum & mask;

    uint64_t a1 = shrld(accum,51);
    a1 = a1*19+c0;
    
    c[0] = a1 & mask;
    c[1] = c1 + (a1>>51);
}